

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

int __thiscall amrex::Amr::init(Amr *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  int iVar2;
  ulong uVar3;
  Real in_XMM0_Qa;
  BoxArray *in_XMM1_Qa;
  Amr *unaff_retaddr;
  string *in_stack_00001290;
  Amr *in_stack_00001298;
  char *in_stack_ffffffffffffffd8;
  Amr *strt_time;
  
  strt_time = this;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,in_stack_ffffffffffffffd8), bVar1)) {
    restart(in_stack_00001298,in_stack_00001290);
    iVar2 = extraout_EAX;
  }
  else {
    initialInit(unaff_retaddr,(Real)strt_time,in_XMM0_Qa,in_XMM1_Qa,
                (Vector<int,_std::allocator<int>_> *)this);
    if ((0 < this->check_int) || (0.0 < this->check_per)) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])();
    }
    if (((0 < this->plot_int) || (0.0 < this->plot_per)) || (0.0 < this->plot_log_per)) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])();
    }
    if (((0 < this->small_plot_int) || (0.0 < this->small_plot_per)) ||
       (0.0 < this->small_plot_log_per)) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xe])();
    }
    iVar2 = updateInSitu(this);
  }
  return iVar2;
}

Assistant:

void
Amr::init (Real strt_time,
           Real stop_time)
{
    BL_PROFILE_REGION_START("Amr::init()");
    BL_PROFILE("Amr::init()");
    if( ! restart_chkfile.empty() && restart_chkfile != "init")
    {
        restart(restart_chkfile);
    }
    else
    {
        initialInit(strt_time,stop_time);
        if (check_int > 0 || check_per > 0) {
            checkPoint();
        }

        if(plot_int > 0 || plot_per > 0 || plot_log_per > 0) {
            writePlotFile();
        }

        if (small_plot_int > 0 || small_plot_per > 0 || small_plot_log_per > 0) {
            writeSmallPlotFile();
        }

        updateInSitu();
    }

#ifdef BL_COMM_PROFILING
    Vector<Box> probDomain(maxLevel()+1);
    for(int i(0); i < probDomain.size(); ++i) {
        probDomain[i] = Geom(i).Domain();
    }
    BL_COMM_PROFILE_INITAMR(finest_level, max_level, ref_ratio, probDomain);
#endif
    BL_PROFILE_REGION_STOP("Amr::init()");
}